

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts
          (TensorValue_RepeatedLongInts *this)

{
  ~TensorValue_RepeatedLongInts(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TensorValue_RepeatedLongInts::~TensorValue_RepeatedLongInts() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}